

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

Hop_Obj_t * Abc_RecToHop3(Hop_Man_t *pMan,If_Man_t *pIfMan,If_Cut_t *pCut,If_Obj_t *pIfObj)

{
  byte bVar1;
  Gia_Man_t *pGVar2;
  Vec_Ptr_t *pVVar3;
  Lms_Man_t *pLVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  word *t;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Hop_Obj_t *pHVar10;
  Gia_Obj_t *pObj;
  ulong uVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  uint uCanonPhase;
  int BestPo;
  char pCanonPerm [16];
  uint local_7c;
  Hop_Man_t *local_78;
  ulong local_70;
  int local_64;
  Gia_Man_t *local_60;
  Gia_Obj_t *local_58;
  ulong local_50;
  char local_48 [24];
  
  pLVar4 = s_pMan3;
  local_7c = 0;
  pGVar2 = s_pMan3->pGia;
  local_64 = -1;
  local_78 = pMan;
  if (pIfMan->pPars->fCutMin != 1) {
    __assert_fail("pIfMan->pPars->fCutMin == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x410,"Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)"
                 );
  }
  bVar1 = pCut->field_0x1f;
  t = If_CutTruthW(pIfMan,pCut);
  uVar5 = Abc_TtSupport(t,(uint)bVar1);
  if (uVar5 == 0) {
    pHVar10 = local_78->pConst1;
    uVar5 = If_CutTruthIsCompl(pCut);
    pHVar10 = (Hop_Obj_t *)((ulong)uVar5 ^ (ulong)pHVar10 ^ 1);
  }
  else {
    iVar6 = Abc_TtSuppIsMinBase(uVar5);
    if ((uVar5 == 1) || (iVar6 == 0)) {
      if ((uVar5 & uVar5 - 1) != 0) {
        __assert_fail("Abc_TtSuppOnlyOne(uSupport)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x418,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      iVar6 = Abc_TtSuppFindFirst(uVar5);
      pHVar10 = Hop_IthVar(local_78,iVar6);
      uVar5 = If_CutTruthIsCompl(pCut);
      pHVar10 = (Hop_Obj_t *)((ulong)uVar5 ^ (ulong)pHVar10);
    }
    else {
      uVar5 = Gia_WordCountOnes(uVar5);
      if (uVar5 != bVar1) {
        __assert_fail("Gia_WordCountOnes(uSupport) == nLeaves",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x41b,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      If_CutFindBestStruct(pIfMan,pCut,local_48,&local_7c,&local_64);
      if (local_64 < 0) {
        __assert_fail("BestPo >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x41f,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pGVar8 = Gia_ManCo(pGVar2,local_64);
      if (pGVar2->vTtNodes == (Vec_Int_t *)0x0) {
        pVVar9 = Vec_IntAlloc(0x100);
        pGVar2->vTtNodes = pVVar9;
      }
      if (((int)(uint)*(undefined8 *)(pGVar8 + -(*(ulong *)pGVar8 & 0x1fffffff)) < 0) ||
         (((uint)*(undefined8 *)(pGVar8 + -(*(ulong *)pGVar8 & 0x1fffffff)) & 0x1fffffff) ==
          0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x424,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      Gia_ObjCollectInternal(pGVar2,pGVar8 + -(*(ulong *)pGVar8 & 0x1fffffff));
      uVar5 = local_7c;
      local_60 = pGVar2;
      if (pGVar2->vTtNodes->nSize < 1) {
        __assert_fail("Vec_IntSize(pGia->vTtNodes) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x426,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pLVar4->vLabelsP->nSize = 0;
      uVar11 = (ulong)local_7c;
      for (uVar14 = 0; bVar1 != uVar14; uVar14 = uVar14 + 1) {
        pVVar3 = pLVar4->vLabelsP;
        pHVar10 = Hop_IthVar(local_78,(int)local_48[uVar14]);
        Vec_PtrPush(pVVar3,(void *)((ulong)((uVar5 >> ((uint)uVar14 & 0x1f) & 1) != 0) ^
                                   (ulong)pHVar10));
      }
      pObj = (Gia_Obj_t *)0x0;
      iVar6 = 0;
      local_70 = (ulong)bVar1;
      local_58 = pGVar8;
      local_50 = uVar11;
      while( true ) {
        uVar11 = local_50;
        pGVar2 = local_60;
        if (local_60->vTtNodes->nSize <= iVar6) break;
        iVar7 = Vec_IntEntry(local_60->vTtNodes,iVar6);
        pObj = Gia_ManObj(pGVar2,iVar7);
        uVar11 = *(ulong *)pObj;
        *(ulong *)pObj = uVar11 & 0xffffffffbfffffff;
        uVar11 = (ulong)((uint)uVar11 & 0x1fffffff);
        pVVar3 = pLVar4->vLabelsP;
        if ((~*(uint *)(pObj + -uVar11) & 0x1fffffff) == 0 || (int)*(uint *)(pObj + -uVar11) < 0) {
          iVar7 = Gia_ObjCioId(pObj + -uVar11);
        }
        else {
          iVar7 = Gia_ObjNum(pGVar2,pObj + -uVar11);
          iVar7 = iVar7 + (int)local_70;
        }
        pvVar12 = Vec_PtrEntry(pVVar3,iVar7);
        uVar11 = *(ulong *)pObj;
        uVar14 = (ulong)((uint)(uVar11 >> 0x20) & 0x1fffffff);
        pVVar3 = pLVar4->vLabelsP;
        if ((~*(uint *)(pObj + -uVar14) & 0x1fffffff) == 0 || (int)*(uint *)(pObj + -uVar14) < 0) {
          iVar7 = Gia_ObjCioId(pObj + -uVar14);
        }
        else {
          iVar7 = Gia_ObjNum(local_60,pObj + -uVar14);
          iVar7 = iVar7 + (int)local_70;
        }
        pvVar13 = Vec_PtrEntry(pVVar3,iVar7);
        pHVar10 = Hop_And(local_78,(Hop_Obj_t *)
                                   ((ulong)((uint)(uVar11 >> 0x1d) & 1) ^ (ulong)pvVar12),
                          (Hop_Obj_t *)
                          ((ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1) ^ (ulong)pvVar13)
                         );
        Vec_PtrPush(pLVar4->vLabelsP,pHVar10);
        iVar6 = iVar6 + 1;
      }
      if (((int)(uint)*(undefined8 *)pObj < 0) ||
         (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pGiaTemp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                      ,0x440,
                      "Hop_Obj_t *Abc_RecToHop3(Hop_Man_t *, If_Man_t *, If_Cut_t *, If_Obj_t *)");
      }
      pVVar3 = pLVar4->vLabelsP;
      iVar6 = Gia_ObjNum(local_60,pObj);
      uVar14 = local_70;
      pvVar12 = Vec_PtrEntry(pVVar3,iVar6 + (int)local_70);
      pHVar10 = (Hop_Obj_t *)
                ((ulong)(((uint)uVar11 >> ((byte)uVar14 & 0x1f) ^ *(uint *)local_58 >> 0x1d) & 1) ^
                (ulong)pvVar12);
    }
  }
  return pHVar10;
}

Assistant:

Hop_Obj_t * Abc_RecToHop3( Hop_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, If_Obj_t * pIfObj )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase = 0;
    Hop_Obj_t * pFan0, * pFan1, * pHopObj;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pGiaPo, * pGiaTemp = NULL;
    int i, uSupport, BestPo = -1, nLeaves = If_CutLeaveNum(pCut);
    assert( pIfMan->pPars->fCutMin == 1 );

    // compute support
    uSupport = Abc_TtSupport( If_CutTruthW(pIfMan, pCut), nLeaves );
    if ( uSupport == 0 )
        return Hop_NotCond( Hop_ManConst0(pMan), If_CutTruthIsCompl(pCut) );
    if ( !Abc_TtSuppIsMinBase(uSupport) || uSupport == 1 )
    {
        assert( Abc_TtSuppOnlyOne(uSupport) );
        return Hop_NotCond( Hop_IthVar(pMan, Abc_TtSuppFindFirst(uSupport)), If_CutTruthIsCompl(pCut) );
    }
    assert( Gia_WordCountOnes(uSupport) == nLeaves );

    // get the best output for this node
    If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, &BestPo );
    assert( BestPo >= 0 );
    pGiaPo = Gia_ManCo( pGia, BestPo );
    // collect internal nodes into pGia->vTtNodes
    if ( pGia->vTtNodes == NULL )
        pGia->vTtNodes = Vec_IntAlloc( 256 );
    assert( Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) ) );
    Gia_ObjCollectInternal( pGia, Gia_ObjFanin0(pGiaPo) );
    assert( Vec_IntSize(pGia->vTtNodes) > 0 );

    // collect HOP nodes for leaves
    Vec_PtrClear( p->vLabelsP );
    for ( i = 0; i < nLeaves; i++ )
        Vec_PtrPush( p->vLabelsP, Hop_NotCond(Hop_IthVar(pMan, pCanonPerm[i]), (uCanonPhase >> i) & 1) );

    // compute HOP nodes for internal nodes
    Gia_ManForEachObjVec( pGia->vTtNodes, pGia, pGiaTemp, i )
    {
        pGiaTemp->fMark0 = 0; // unmark node marked by Gia_ObjCollectInternal()
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pGiaTemp)) )
            pFan0 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, Gia_ObjFanin0(pGiaTemp)) + nLeaves);
        else
            pFan0 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjCioId(Gia_ObjFanin0(pGiaTemp)));
        pFan0 = Hop_NotCond(pFan0, Gia_ObjFaninC0(pGiaTemp));
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pGiaTemp)) )
            pFan1 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, Gia_ObjFanin1(pGiaTemp)) + nLeaves);
        else
            pFan1 = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjCioId(Gia_ObjFanin1(pGiaTemp)));
        pFan1 = Hop_NotCond(pFan1, Gia_ObjFaninC1(pGiaTemp));

        pHopObj = Hop_And(pMan, pFan0, pFan1);
        Vec_PtrPush(p->vLabelsP, pHopObj);
    }
    // get the final result
    assert( Gia_ObjIsAnd(pGiaTemp) );
    pHopObj = (Hop_Obj_t *)Vec_PtrEntry(p->vLabelsP, Gia_ObjNum(pGia, pGiaTemp) + nLeaves);
    // complement the result if needed
    return Hop_NotCond( pHopObj,  Gia_ObjFaninC0(pGiaPo) ^ ((uCanonPhase >> nLeaves) & 1) );    
}